

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O1

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CClass *stm)

{
  element_type *peVar1;
  CIdExp *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  CFieldList *pCVar4;
  element_type *peVar5;
  CMethodList *pCVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ClassInfo *this_00;
  VariablesInfo *pVVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar1->iName,0,(char *)(peVar1->iName)._M_string_length,0x15c41a);
  pCVar2 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  this_00 = (ClassInfo *)operator_new(0x88);
  ClassInfo::ClassInfo
            (this_00,&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ClassInfo*>(a_Stack_30,this_00);
  _Var7._M_pi = a_Stack_30[0]._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (peVar1->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  (peVar1->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  if ((stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl != (CIdExp *)0x0) {
    peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar1->iName,0,(char *)(peVar1->iName)._M_string_length,0x15c41a);
    pCVar2 = (stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
             _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
    std::__cxx11::string::_M_assign
              ((string *)
               &((((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                baseClass);
  }
  pVVar8 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VariablesInfo*>(a_Stack_30,pVVar8)
  ;
  _Var7._M_pi = a_Stack_30[0]._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pVVar8
  ;
  (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  pVVar8 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VariablesInfo*>(a_Stack_30,pVVar8)
  ;
  _Var7._M_pi = a_Stack_30[0]._M_pi;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (peVar1->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pVVar8;
  (peVar1->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  pCVar4 = (stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar4 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  }
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = (peVar1->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar5->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar5->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>
             + 8),&(peVar1->iVariables).
                   super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pCVar6 = (stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>
           ._M_t.super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
           super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl;
  if (pCVar6 != (CMethodList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar6->super_IWrapper).super_PositionedNode)(pCVar6,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CClass &stm )
{
//	std::cout << "class\n";
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iClass = std::shared_ptr<ClassInfo>( new ClassInfo( info->iName ) );

	if( stm.parentClass ) {
		info->iName = "";
		stm.parentClass->Accept( *this );
		info->iClass->baseClass = info->iName;
	}

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
    info->definedVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.fields ) {
		stm.fields->Accept( *this );
	}
	info->iClass->fields = info->iVariables;

	if( stm.methods ) {
		stm.methods->Accept( *this );
	}
}